

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calcdb.cc
# Opt level: O2

void __thiscall
DbaseCtrlBlk::get_next_trans(DbaseCtrlBlk *this,int **lbuf,int *nitems,int *tid,int *cid)

{
  int iVar1;
  int *piVar2;
  unsigned_long uVar3;
  int iVar4;
  
  iVar4 = this->cur_buf_pos + 3;
  if ((this->cur_blk_size <= (ulong)(long)iVar4) ||
     (this->cur_blk_size < (ulong)(long)(iVar4 + this->buf[(long)this->cur_buf_pos + 2]))) {
    uVar3 = lseek(this->fd,0,1);
    if (uVar3 == this->endpos) {
      this->readall = '\x01';
    }
    else if (this->readall == '\0') {
      get_next_trans_ext(this);
    }
  }
  if (this->readall == '\0') {
    piVar2 = this->buf;
    *cid = piVar2[this->cur_buf_pos];
    *tid = piVar2[(long)this->cur_buf_pos + 1];
    iVar4 = piVar2[(long)this->cur_buf_pos + 2];
    *nitems = iVar4;
    iVar1 = this->cur_buf_pos;
    *lbuf = piVar2 + (long)iVar1 + 3;
    this->cur_buf_pos = iVar4 + iVar1 + 3;
  }
  return;
}

Assistant:

void DbaseCtrlBlk::get_next_trans(int *&lbuf, int &nitems, int &tid, int &cid) {
    if (cur_buf_pos + TRANSOFF >= cur_blk_size ||
        cur_buf_pos + buf[cur_buf_pos + TRANSOFF - 1] + TRANSOFF > cur_blk_size) {
        if (lseek(fd, 0, SEEK_CUR) == endpos) readall = 1;
        if (!readall) {
            // Need to get more items from file
            get_next_trans_ext();
        }
    }

    if (!readall) {
        cid = buf[cur_buf_pos];
        tid = buf[cur_buf_pos + TRANSOFF - 2];
        nitems = buf[cur_buf_pos + TRANSOFF - 1];
        lbuf = buf + cur_buf_pos + TRANSOFF;
        cur_buf_pos += nitems + TRANSOFF;
    }
}